

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *
pbrt::CreateCurve(vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                  *__return_storage_ptr__,Transform *renderFromObject,Transform *objectFromRender,
                 bool reverseOrientation,span<const_pbrt::Point3<float>_> c,Float w0,Float w1,
                 CurveType type,span<const_pbrt::Normal3<float>_> norm,int splitDepth,
                 Allocator alloc)

{
  ShapeHandle *pSVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  ulong uVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar8;
  int iVar9;
  long lVar10;
  size_t n;
  long in_FS_OFFSET;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [32];
  undefined1 in_ZMM5 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [32];
  
  auVar13 = in_ZMM5._0_32_;
  iVar7 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x78,8);
  CurveCommon::CurveCommon
            ((CurveCommon *)CONCAT44(extraout_var,iVar7),c,w0,w1,type,norm,renderFromObject,
             objectFromRender,reverseOrientation);
  iVar9 = 1 << (splitDepth & 0x1fU);
  n = (size_t)iVar9;
  (__return_storage_ptr__->alloc).memoryResource = alloc.memoryResource;
  __return_storage_ptr__->ptr = (ShapeHandle *)0x0;
  __return_storage_ptr__->nAlloc = 0;
  __return_storage_ptr__->nStored = 0;
  pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::reserve
            (__return_storage_ptr__,n);
  memset(__return_storage_ptr__->ptr,0,n * 8);
  __return_storage_ptr__->nStored = n;
  iVar7 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,n * 0x10,8);
  if (splitDepth != 0x1f) {
    auVar24 = ZEXT864(*(ulong *)(in_FS_OFFSET + -0x580));
    auVar5 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar15 = vpbroadcastq_avx512f(ZEXT816(0x6000000000000));
    auVar16 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar25._8_4_ = 8;
    auVar25._0_8_ = 0x800000008;
    auVar25._12_4_ = 8;
    auVar25._16_4_ = 8;
    auVar25._20_4_ = 8;
    auVar25._24_4_ = 8;
    auVar25._28_4_ = 8;
    auVar23._0_4_ = (float)iVar9;
    auVar13 = vpcmpeqd_avx2(auVar13,auVar13);
    auVar17 = vpbroadcastq_avx512f();
    auVar18 = vpternlogd_avx512f(in_ZMM8,in_ZMM8,in_ZMM8,0xff);
    iVar8 = 1;
    if (1 < iVar9) {
      iVar8 = iVar9;
    }
    pSVar1 = __return_storage_ptr__->ptr;
    auVar19 = vpbroadcastq_avx512f();
    auVar23._4_4_ = auVar23._0_4_;
    auVar23._8_4_ = auVar23._0_4_;
    auVar23._12_4_ = auVar23._0_4_;
    auVar23._16_4_ = auVar23._0_4_;
    auVar23._20_4_ = auVar23._0_4_;
    auVar23._24_4_ = auVar23._0_4_;
    auVar23._28_4_ = auVar23._0_4_;
    auVar20 = vpbroadcastq_avx512f();
    lVar10 = 0;
    do {
      auVar11 = vpmovqd_avx512f(auVar14);
      auVar21 = vmovdqa64_avx512f(auVar24);
      auVar12 = vcvtudq2ps_avx512vl(auVar5);
      uVar6 = vpcmpuq_avx512f(auVar14,auVar19,2);
      auVar24 = vpsllq_avx512f(auVar14,4);
      auVar14 = vpaddq_avx512f(auVar14,auVar16);
      auVar5 = vpaddd_avx2(auVar25,auVar5);
      auVar22 = vpaddq_avx512f(auVar17,auVar24);
      vpscatterqq_avx512f(ZEXT864(CONCAT44(extraout_var_00,iVar7)) + auVar24,uVar6,auVar20);
      auVar12 = vdivps_avx(auVar12,auVar23);
      auVar11 = vpsubd_avx2(auVar11,auVar13);
      auVar11 = vcvtudq2ps_avx512vl(auVar11);
      auVar11 = vdivps_avx(auVar11,auVar23);
      vscatterqps_avx512f(ZEXT864(8) + auVar22,uVar6,auVar12);
      auVar24 = vporq_avx512f(auVar22,auVar15);
      vscatterqps_avx512f(ZEXT864(0xc) + auVar22,uVar6,auVar11);
      auVar24 = vmovdqu64_avx512f(auVar24);
      *(undefined1 (*) [64])
       ((long)&(pSVar1->
               super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
               ).bits + lVar10) = auVar24;
      auVar24 = vpsubq_avx512f(auVar21,auVar18);
      lVar10 = lVar10 + 0x40;
    } while ((ulong)(iVar8 + 7U >> 3) << 6 != lVar10);
    auVar14 = vmovdqa64_avx512f(auVar24);
    bVar2 = (bool)((byte)uVar6 & 1);
    auVar15._0_8_ = (ulong)bVar2 * auVar14._0_8_ | (ulong)!bVar2 * auVar21._0_8_;
    bVar2 = (bool)((byte)(uVar6 >> 1) & 1);
    auVar15._8_8_ = (ulong)bVar2 * auVar14._8_8_ | (ulong)!bVar2 * auVar21._8_8_;
    bVar2 = (bool)((byte)(uVar6 >> 2) & 1);
    auVar15._16_8_ = (ulong)bVar2 * auVar14._16_8_ | (ulong)!bVar2 * auVar21._16_8_;
    bVar2 = (bool)((byte)(uVar6 >> 3) & 1);
    auVar15._24_8_ = (ulong)bVar2 * auVar14._24_8_ | (ulong)!bVar2 * auVar21._24_8_;
    bVar2 = (bool)((byte)(uVar6 >> 4) & 1);
    auVar15._32_8_ = (ulong)bVar2 * auVar14._32_8_ | (ulong)!bVar2 * auVar21._32_8_;
    bVar2 = (bool)((byte)(uVar6 >> 5) & 1);
    auVar15._40_8_ = (ulong)bVar2 * auVar14._40_8_ | (ulong)!bVar2 * auVar21._40_8_;
    bVar2 = (bool)((byte)(uVar6 >> 6) & 1);
    auVar15._48_8_ = (ulong)bVar2 * auVar14._48_8_ | (ulong)!bVar2 * auVar21._48_8_;
    auVar15._56_8_ = (uVar6 >> 7) * auVar14._56_8_ | (ulong)!SUB81(uVar6 >> 7,0) * auVar21._56_8_;
    auVar13 = vextracti64x4_avx512f(auVar15,1);
    auVar14 = vpaddq_avx512f(auVar15,ZEXT3264(auVar13));
    auVar3 = vpaddq_avx(auVar14._0_16_,auVar14._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpaddq_avx(auVar3,auVar4);
    *(long *)(in_FS_OFFSET + -0x580) = auVar3._0_8_;
  }
  *(size_t *)(in_FS_OFFSET + -0x578) = n * 0x10 + 0x78 + *(long *)(in_FS_OFFSET + -0x578);
  return __return_storage_ptr__;
}

Assistant:

pstd::vector<ShapeHandle> CreateCurve(const Transform *renderFromObject,
                                      const Transform *objectFromRender,
                                      bool reverseOrientation,
                                      pstd::span<const Point3f> c, Float w0, Float w1,
                                      CurveType type, pstd::span<const Normal3f> norm,
                                      int splitDepth, Allocator alloc) {
    CurveCommon *common = alloc.new_object<CurveCommon>(
        c, w0, w1, type, norm, renderFromObject, objectFromRender, reverseOrientation);

    const int nSegments = 1 << splitDepth;
    pstd::vector<ShapeHandle> segments(nSegments, alloc);
    Curve *curves = alloc.allocate_object<Curve>(nSegments);
    for (int i = 0; i < nSegments; ++i) {
        Float uMin = i / (Float)nSegments;
        Float uMax = (i + 1) / (Float)nSegments;
        alloc.construct(&curves[i], common, uMin, uMax);
        segments[i] = &curves[i];
        ++nSplitCurves;
    }

    curveBytes += sizeof(CurveCommon) + nSegments * sizeof(Curve);
    return segments;
}